

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_parser_parser.cpp
# Opt level: O2

vector<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
* duckdb_libpgquery::tokenize
            (vector<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
             *__return_storage_ptr__,char *str)

{
  int iVar1;
  core_yyscan_t yyscanner;
  PGSimplifiedToken current_token;
  int loc;
  YYSTYPE type;
  base_yy_extra_type yyextra;
  value_type local_c4;
  int local_bc;
  YYSTYPE local_b8;
  core_yy_extra_type local_b0;
  undefined1 local_60;
  
  (__return_storage_ptr__->
  super__Vector_base<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  yyscanner = scanner_init(str,&local_b0,(PGScanKeyword *)&ScanKeywords,0x1e3);
  local_60 = 0;
  do {
    iVar1 = base_yylex(&local_b8,&local_bc,yyscanner);
    if (iVar1 == 0) {
      scanner_finish(yyscanner);
      return __return_storage_ptr__;
    }
    switch(iVar1) {
    case 0x102:
      local_c4.type = PG_SIMPLIFIED_TOKEN_IDENTIFIER;
      break;
    case 0x103:
    case 0x108:
      local_c4.type = PG_SIMPLIFIED_TOKEN_NUMERIC_CONSTANT;
      break;
    case 0x104:
    case 0x105:
    case 0x106:
      local_c4.type = PG_SIMPLIFIED_TOKEN_STRING_CONSTANT;
      break;
    case 0x107:
    case 0x109:
    case 0x10c:
    case 0x10d:
    case 0x112:
    case 0x113:
    case 0x114:
switchD_01b06179_caseD_107:
      local_c4.type = PG_SIMPLIFIED_TOKEN_OPERATOR;
      break;
    default:
      if (iVar1 < 0xff) goto switchD_01b06179_caseD_107;
      local_c4.type = PG_SIMPLIFIED_TOKEN_KEYWORD;
    }
    local_c4.start = local_bc;
    std::
    vector<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
    ::push_back(__return_storage_ptr__,&local_c4);
  } while( true );
}

Assistant:

std::vector<PGSimplifiedToken> tokenize(const char *str) {
	core_yyscan_t yyscanner;
	base_yy_extra_type yyextra;

	std::vector<PGSimplifiedToken> result;
	yyscanner = scanner_init(str, &yyextra.core_yy_extra, ScanKeywords, NumScanKeywords);
	yyextra.have_lookahead = false;

	while(true) {
		YYSTYPE type;
		YYLTYPE loc;
		int token;
		try {
			token = base_yylex(&type, &loc, yyscanner);
		} catch(...) {
			token = 0;
		}
		if (token == 0) {
			break;
		}
		PGSimplifiedToken current_token;
		switch(token) {
		case IDENT:
			current_token.type = PGSimplifiedTokenType::PG_SIMPLIFIED_TOKEN_IDENTIFIER;
			break;
		case ICONST:
		case FCONST:
			current_token.type = PGSimplifiedTokenType::PG_SIMPLIFIED_TOKEN_NUMERIC_CONSTANT;
			break;
		case SCONST:
		case BCONST:
		case XCONST:
			current_token.type = PGSimplifiedTokenType::PG_SIMPLIFIED_TOKEN_STRING_CONSTANT;
			break;
		case Op:
		case PARAM:
		case COLON_EQUALS:
		case EQUALS_GREATER:
		case LESS_EQUALS:
		case GREATER_EQUALS:
		case NOT_EQUALS:
			current_token.type = PGSimplifiedTokenType::PG_SIMPLIFIED_TOKEN_OPERATOR;
			break;
		default:
			if (token >= 255) {
				// non-ascii value, probably a keyword
				current_token.type = PGSimplifiedTokenType::PG_SIMPLIFIED_TOKEN_KEYWORD;
			} else {
				// ascii value, probably an operator
				current_token.type = PGSimplifiedTokenType::PG_SIMPLIFIED_TOKEN_OPERATOR;
			}
			break;
		}
		current_token.start = loc;
		result.push_back(current_token);
	}

	scanner_finish(yyscanner);
	return result;
}